

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

void duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::InitializeFileScanState
               (ClientContext *context,MultiFileReaderData *reader_data,MultiFileLocalState *lstate,
               vector<unsigned_long,_true> *projection_ids)

{
  shared_ptr<duckdb::BaseFileReader,_true> *this;
  size_type __n;
  size_type *psVar1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar2;
  type pBVar3;
  BaseFileReader *pBVar4;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  pointer pEVar8;
  const_reference pvVar9;
  reference this_00;
  type pEVar10;
  iterator __begin3;
  size_type *psVar11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  ExpressionExecutor *this_02;
  value_type *__x;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_03;
  idx_t i;
  ulong __n_00;
  vector<duckdb::LogicalType,_true> intermediate_chunk_types;
  size_type local_80;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  vector<unsigned_long,_true> *local_60;
  MultiFileReaderData *local_58;
  ClientContext *local_50;
  vector<duckdb::MultiFileColumnDefinition,_true> *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalType>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_38;
  
  this = &lstate->reader;
  local_60 = projection_ids;
  local_50 = context;
  shared_ptr<duckdb::BaseFileReader,_true>::operator=(this,&reader_data->reader);
  (lstate->reader_data).ptr = reader_data;
  local_58 = reader_data;
  pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(this);
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar4 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(this);
  local_38 = &pBVar3->column_ids;
  local_48 = &pBVar4->columns;
  local_40 = &(pBVar3->cast_map)._M_h;
  __n_00 = 0;
  do {
    if ((ulong)((long)(pBVar3->column_ids).column_ids.
                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      .
                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar3->column_ids).column_ids.
                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      .
                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
      DataChunk::Destroy(&lstate->scan_chunk);
      DataChunk::Initialize
                (&lstate->scan_chunk,local_50,(vector<duckdb::LogicalType,_true> *)&local_78,0x800);
      this_02 = &lstate->executor;
      ExpressionExecutor::ClearExpressions(this_02);
      psVar11 = (local_60->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar1 = (local_60->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar11 == psVar1) {
        puVar2 = (local_58->expressions).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_01 = (local_58->expressions).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar2;
            this_01 = this_01 + 1) {
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(this_01);
          ExpressionExecutor::AddExpression(this_02,pEVar10);
        }
      }
      else {
        this_03 = &local_58->expressions;
        for (; psVar11 != psVar1; psVar11 = psVar11 + 1) {
          this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(this_03,*psVar11);
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(this_00);
          ExpressionExecutor::AddExpression(this_02,pEVar10);
        }
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
      return;
    }
    pvVar5 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>(&local_38->column_ids,__n_00);
    __n = pvVar5->column_id;
    local_80 = __n;
    iVar6 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LogicalType>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_40,&local_80);
    local_80 = __n;
    iVar7 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(pBVar3->expression_map)._M_h,&local_80);
    if (iVar6.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>.
        _M_cur == (__node_type *)0x0) {
      if (iVar7.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)((long)iVar7.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_false>
                                      ._M_cur + 0x10));
        __x = &pEVar8->return_type;
        goto LAB_01da13b9;
      }
      pvVar9 = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>(local_48,__n);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_78,&pvVar9->type);
    }
    else {
      __x = (value_type *)
            ((long)iVar6.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LogicalType>,_false>
                   ._M_cur + 0x10);
LAB_01da13b9:
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_78,__x);
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

static void InitializeFileScanState(ClientContext &context, MultiFileReaderData &reader_data,
	                                    MultiFileLocalState &lstate, vector<idx_t> &projection_ids) {
		lstate.reader = reader_data.reader;
		lstate.reader_data = reader_data;
		auto &reader = *lstate.reader;
		//! Initialize the intermediate chunk to be used by the underlying reader before being finalized
		vector<LogicalType> intermediate_chunk_types;
		auto &local_column_ids = reader.column_ids;
		auto &local_columns = lstate.reader->GetColumns();
		for (idx_t i = 0; i < local_column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto local_id = local_column_ids[local_idx];
			auto cast_entry = reader.cast_map.find(local_id);
			auto expr_entry = reader.expression_map.find(local_id);
			if (cast_entry != reader.cast_map.end()) {
				intermediate_chunk_types.push_back(cast_entry->second);
			} else if (expr_entry != reader.expression_map.end()) {
				intermediate_chunk_types.push_back(expr_entry->second->return_type);
			} else {
				auto &col = local_columns[local_id];
				intermediate_chunk_types.push_back(col.type);
			}
		}
		lstate.scan_chunk.Destroy();
		lstate.scan_chunk.Initialize(context, intermediate_chunk_types);

		auto &executor = lstate.executor;
		executor.ClearExpressions();
		if (!projection_ids.empty()) {
			for (auto &id : projection_ids) {
				executor.AddExpression(*reader_data.expressions[id]);
			}
		} else {
			for (auto &expr : reader_data.expressions) {
				executor.AddExpression(*expr);
			}
		}
	}